

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O3

uint16_t __thiscall ami_nvar_t::nvar_entry_body_t::extended_header_size(nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  uint16_t uVar2;
  
  if (this->f_extended_header_size != true) {
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if ((((pnVar1->m_extended_header == true) && (pnVar1->m_valid == true)) &&
        (0xc < this->m__parent->m_size)) && (uVar2 = extended_header_size_field(this), 2 < uVar2)) {
      uVar2 = extended_header_size_field(this);
    }
    else {
      uVar2 = 0;
    }
    this->m_extended_header_size = uVar2;
    this->f_extended_header_size = true;
    return uVar2;
  }
  return this->m_extended_header_size;
}

Assistant:

uint16_t ami_nvar_t::nvar_entry_body_t::extended_header_size() {
    if (f_extended_header_size)
        return m_extended_header_size;
    m_extended_header_size = (( ((_parent()->attributes()->extended_header()) && (_parent()->attributes()->valid()) && (_parent()->size() > (((4 + 2) + 4) + 2))) ) ? (((extended_header_size_field() >= (1 + 2)) ? (extended_header_size_field()) : (0))) : (0));
    f_extended_header_size = true;
    return m_extended_header_size;
}